

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O1

int __thiscall
CAPSFile::AddGapRecord(CAPSFile *this,StreamRecording *record,int nb_byte_to_add,uchar byte)

{
  uchar *__src;
  bool bVar1;
  uchar *__dest;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  uVar2 = nb_byte_to_add * 8;
  if (0 < nb_byte_to_add) {
    do {
      iVar3 = iVar3 + 1;
      bVar1 = 0xff < uVar2;
      uVar2 = uVar2 >> 8;
    } while (bVar1);
  }
  uVar2 = record->size;
  if (uVar2 - record->offset <= iVar3 + 5U) {
    __src = record->buffer;
    __dest = (uchar *)operator_new__((ulong)(uVar2 * 2));
    record->buffer = __dest;
    memcpy(__dest,__src,(ulong)uVar2);
    record->size = uVar2 * 2;
    if (__src != (uchar *)0x0) {
      operator_delete__(__src);
    }
  }
  if (iVar3 != 0) {
    uVar2 = record->offset;
    record->offset = uVar2 + 1;
    record->buffer[uVar2] = (char)iVar3 * ' ' + '\x01';
    iVar3 = iVar3 * 8 + -8;
    do {
      uVar2 = record->offset;
      record->offset = uVar2 + 1;
      record->buffer[uVar2] = (uchar)(nb_byte_to_add * 8 >> ((byte)iVar3 & 0x1f));
      iVar3 = iVar3 + -8;
    } while (iVar3 != -8);
    uVar2 = record->offset;
    record->offset = uVar2 + 1;
    record->buffer[uVar2] = '\"';
    uVar2 = record->offset;
    record->offset = uVar2 + 1;
    record->buffer[uVar2] = '\b';
    uVar2 = record->offset;
    record->offset = uVar2 + 1;
    record->buffer[uVar2] = byte;
    uVar2 = record->offset;
    record->offset = uVar2 + 1;
    record->buffer[uVar2] = '\0';
  }
  return 0;
}

Assistant:

int CAPSFile::AddGapRecord(StreamRecording* record, int nb_byte_to_add, unsigned char byte)
{
   unsigned int size = 0;
   nb_byte_to_add *= 8;
   int tmp = nb_byte_to_add;
   while (tmp > 0)
   {
      tmp >>= 8;
      size++;
   }

   if (record->size - record->offset <= (size + 5))
   {
      unsigned char* tmp = record->buffer;

      record->buffer = new unsigned char[record->size * 2];
      memcpy(record->buffer, tmp, record->size);
      record->size = record->size * 2;
      delete[]tmp;
   }
   if (size > 0)
   {
      record->buffer[record->offset++] = (size << 5) | 0x01;
      for (unsigned int c = 0; c < size; c++)
      {
         record->buffer[record->offset++] = ((nb_byte_to_add >> (8 * (size - (c + 1)))) & 0xFF);
      }

      // Sample now
      record->buffer[record->offset++] = (1 << 5) | 0x02;
      record->buffer[record->offset++] = 8;
      record->buffer[record->offset++] = byte; // Sample
      record->buffer[record->offset++] = 0x00; // End of data
   }
   return 0;
}